

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.l.cpp
# Opt level: O1

void __thiscall deci_FlexLexer::yypush_buffer_state(deci_FlexLexer *this,YY_BUFFER_STATE new_buffer)

{
  yy_buffer_state **ppyVar1;
  size_t sVar2;
  
  if (new_buffer != (YY_BUFFER_STATE)0x0) {
    yyensure_buffer_stack(this);
    if ((this->yy_buffer_stack != (yy_buffer_state **)0x0) &&
       (this->yy_buffer_stack[this->yy_buffer_stack_top] != (yy_buffer_state *)0x0)) {
      *this->yy_c_buf_p = this->yy_hold_char;
      ppyVar1 = this->yy_buffer_stack;
      sVar2 = this->yy_buffer_stack_top;
      ppyVar1[sVar2]->yy_buf_pos = this->yy_c_buf_p;
      ppyVar1[sVar2]->yy_n_chars = this->yy_n_chars;
    }
    ppyVar1 = this->yy_buffer_stack;
    if ((ppyVar1 != (yy_buffer_state **)0x0) &&
       (ppyVar1[this->yy_buffer_stack_top] != (yy_buffer_state *)0x0)) {
      this->yy_buffer_stack_top = this->yy_buffer_stack_top + 1;
    }
    ppyVar1[this->yy_buffer_stack_top] = new_buffer;
    yy_load_buffer_state(this);
    this->yy_did_buffer_switch_on_eof = 1;
  }
  return;
}

Assistant:

void yyFlexLexer::yypush_buffer_state (YY_BUFFER_STATE new_buffer)
{
    	if (new_buffer == NULL)
		return;

	yyensure_buffer_stack();

	/* This block is copied from yy_switch_to_buffer. */
	if ( YY_CURRENT_BUFFER )
		{
		/* Flush out information for old buffer. */
		*(yy_c_buf_p) = (yy_hold_char);
		YY_CURRENT_BUFFER_LVALUE->yy_buf_pos = (yy_c_buf_p);
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = (yy_n_chars);
		}

	/* Only push if top exists. Otherwise, replace top. */
	if (YY_CURRENT_BUFFER)
		(yy_buffer_stack_top)++;
	YY_CURRENT_BUFFER_LVALUE = new_buffer;

	/* copied from yy_switch_to_buffer. */
	yy_load_buffer_state(  );
	(yy_did_buffer_switch_on_eof) = 1;
}